

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SonarLocalization.cpp
# Opt level: O2

void * SonarLocalizationThread(void *pParam)

{
  bool bVar1;
  interval *piVar2;
  double dVar3;
  double dVar4;
  int sdir_tmp;
  undefined4 uStack_6ec;
  double d_max_err_tmp_1;
  box local_6e0;
  double snr_loc_max_err;
  double d_max_err_tmp;
  double local_6b0;
  double local_6a8;
  box P;
  double alpha_max_err_tmp;
  vector<double,_std::allocator<double>_> circles_r_tmp_1;
  double alpha_max_err_tmp_1;
  int sdir_tmp_1;
  vector<double,_std::allocator<double>_> circles_y_tmp_1;
  vector<double,_std::allocator<double>_> circles_r_tmp;
  vector<double,_std::allocator<double>_> circles_y_tmp;
  vector<double,_std::allocator<double>_> circles_x_tmp;
  double local_5e8;
  box P0;
  vector<double,_std::allocator<double>_> walls_yb_tmp;
  box local_5b0;
  deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
  d_all_mes_vector_tmp;
  vector<double,_std::allocator<double>_> walls_xa_tmp;
  interval alphashat_tmp;
  interval psihat_tmp;
  box local_460;
  deque<double,_std::allocator<double>_> alpha_mes_vector_tmp;
  vector<double,_std::allocator<double>_> walls_xb_tmp;
  vector<double,_std::allocator<double>_> walls_ya_tmp;
  interval local_360;
  interval local_348;
  interval local_330;
  interval local_318;
  interval local_300;
  interval local_2e8;
  interval local_2d0;
  interval local_2b8;
  interval local_2a0;
  interval local_288;
  interval local_270;
  interval local_258;
  interval local_240;
  CHRONO chrono_dynamicsonarlocalization;
  interval local_1e0;
  interval local_1c8;
  interval local_1b0;
  interval local_198;
  interval local_180;
  interval local_168;
  interval local_150;
  interval local_138;
  interval local_120;
  interval local_108;
  interval local_f0;
  interval local_d8;
  interval local_c0;
  interval local_a8;
  interval local_90;
  CHRONO chrono_period;
  
  bDynamicSonarLocalization = 0;
  StartChrono(&chrono_dynamicsonarlocalization);
  StartChrono(&chrono_period);
  do {
    StopChronoQuick(&chrono_period);
    StartChrono(&chrono_period);
    uSleep(50000);
    if (bStaticSonarLocalization != 0) {
      pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
      interval::interval(&local_90,(interval *)&xhat);
      interval::interval(&local_a8,(interval *)&yhat);
      box::box(&P,(vector<interval,_std::allocator<interval>_> *)&local_90,
               (vector<interval,_std::allocator<interval>_> *)&local_a8);
      bVar1 = box::IsEmpty(&P);
      if (bVar1) {
        alpha_mes_vector_tmp.super__Deque_base<double,_std::allocator<double>_>._M_impl.
        super__Deque_impl_data._M_map = (_Map_pointer)0xc0c3880000000000;
        psihat_tmp.inf = 10000.0;
        interval::interval(&local_240,(double *)&alpha_mes_vector_tmp,&psihat_tmp.inf);
        alphashat_tmp.inf = -10000.0;
        walls_xa_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x40c3880000000000;
        interval::interval(&local_c0,&alphashat_tmp.inf,(double *)&walls_xa_tmp);
        box::box((box *)&d_all_mes_vector_tmp,
                 (vector<interval,_std::allocator<interval>_> *)&local_240,
                 (vector<interval,_std::allocator<interval>_> *)&local_c0);
        box::operator=(&P,(box *)&d_all_mes_vector_tmp);
        box::~box((box *)&d_all_mes_vector_tmp);
      }
      std::
      deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
      ::deque(&d_all_mes_vector_tmp,&d_all_mes_vector);
      std::deque<double,_std::allocator<double>_>::deque(&alpha_mes_vector_tmp,&alpha_mes_vector);
      interval::interval(&psihat_tmp,(interval *)&psihat);
      d_max_err_tmp = d_max_err;
      alpha_max_err_tmp = alpha_max_err;
      _sdir_tmp = (double)CONCAT44(uStack_6ec,1);
      walls_xa_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      interval::interval(&alphashat_tmp,(double *)&walls_xa_tmp);
      std::vector<double,_std::allocator<double>_>::vector(&walls_xa_tmp,&walls_xa);
      std::vector<double,_std::allocator<double>_>::vector(&walls_ya_tmp,&walls_ya);
      std::vector<double,_std::allocator<double>_>::vector(&walls_xb_tmp,&walls_xb);
      std::vector<double,_std::allocator<double>_>::vector(&walls_yb_tmp,&walls_yb);
      std::vector<double,_std::allocator<double>_>::vector(&circles_x_tmp,&circles_x);
      std::vector<double,_std::allocator<double>_>::vector(&circles_y_tmp,&circles_y);
      std::vector<double,_std::allocator<double>_>::vector(&circles_r_tmp,&circles_r);
      pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
      sched_yield();
      box::box(&local_460,&P);
      SIVIA(&P0,(deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                 *)&local_460,(deque<double,_std::allocator<double>_> *)&d_all_mes_vector_tmp,
            (interval *)&alpha_mes_vector_tmp,&psihat_tmp.inf,&d_max_err_tmp,
            (int *)&alpha_max_err_tmp,(interval *)&sdir_tmp,
            (vector<double,_std::allocator<double>_> *)&alphashat_tmp,&walls_xa_tmp,&walls_ya_tmp,
            &walls_xb_tmp,&walls_yb_tmp,&circles_x_tmp,&circles_y_tmp);
      box::operator=(&P,&P0);
      box::~box(&P0);
      box::~box(&local_460);
      sched_yield();
      pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
      interval::interval(&local_d8,(interval *)&xhat);
      interval::interval(&local_258,(interval *)&yhat);
      box::box(&P0,(vector<interval,_std::allocator<interval>_> *)&local_d8,
               (vector<interval,_std::allocator<interval>_> *)&local_258);
      bVar1 = box::IsEmpty(&P0);
      if (bVar1) {
        circles_r_tmp_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0xc0c3880000000000;
        snr_loc_max_err = 10000.0;
        interval::interval(&local_270,(double *)&circles_r_tmp_1,&snr_loc_max_err);
        local_6e0.data = (interval *)0xc0c3880000000000;
        d_max_err_tmp_1 = 10000.0;
        interval::interval(&local_f0,(double *)&local_6e0,&d_max_err_tmp_1);
        box::box((box *)&circles_y_tmp_1,(vector<interval,_std::allocator<interval>_> *)&local_270,
                 (vector<interval,_std::allocator<interval>_> *)&local_f0);
        box::operator=(&P0,(box *)&circles_y_tmp_1);
        box::~box((box *)&circles_y_tmp_1);
      }
      box::Intersect(&P,&P0);
      dVar4 = d_max_err;
      dVar3 = sin(alpha_max_err);
      snr_loc_max_err = ABS(dVar3 + dVar4 + dVar3 + dVar4);
      bVar1 = box::IsEmpty(&P);
      if (bVar1) {
        local_6e0.data = (interval *)((ulong)snr_loc_max_err ^ 0x8000000000000000);
        interval::interval(&local_288,(double *)&local_6e0,&snr_loc_max_err);
        d_max_err_tmp_1 = -snr_loc_max_err;
        interval::interval(&local_108,&d_max_err_tmp_1,&snr_loc_max_err);
        box::box((box *)&circles_r_tmp_1,(vector<interval,_std::allocator<interval>_> *)&local_288,
                 (vector<interval,_std::allocator<interval>_> *)&local_108);
        operator+((box *)&circles_y_tmp_1,&P0);
        box::operator=(&P,(box *)&circles_y_tmp_1);
      }
      else {
        local_6e0.data = (interval *)((ulong)snr_loc_max_err ^ 0x8000000000000000);
        interval::interval(&local_2a0,(double *)&local_6e0,&snr_loc_max_err);
        d_max_err_tmp_1 = -snr_loc_max_err;
        interval::interval(&local_120,&d_max_err_tmp_1,&snr_loc_max_err);
        box::box((box *)&circles_r_tmp_1,(vector<interval,_std::allocator<interval>_> *)&local_2a0,
                 (vector<interval,_std::allocator<interval>_> *)&local_120);
        operator+((box *)&circles_y_tmp_1,&P);
        box::operator=(&P,(box *)&circles_y_tmp_1);
      }
      box::~box((box *)&circles_y_tmp_1);
      box::~box((box *)&circles_r_tmp_1);
      bVar1 = box::IsEmpty(&P);
      if (bVar1) {
        circles_r_tmp_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0xc0c3880000000000;
        local_6e0.data = (interval *)0x40c3880000000000;
        interval::interval(&local_2b8,(double *)&circles_r_tmp_1,(double *)&local_6e0);
        d_max_err_tmp_1 = -10000.0;
        alpha_max_err_tmp_1 = 10000.0;
        interval::interval(&local_138,&d_max_err_tmp_1,&alpha_max_err_tmp_1);
        box::box((box *)&circles_y_tmp_1,(vector<interval,_std::allocator<interval>_> *)&local_2b8,
                 (vector<interval,_std::allocator<interval>_> *)&local_138);
        box::operator=(&P,(box *)&circles_y_tmp_1);
        box::~box((box *)&circles_y_tmp_1);
      }
      piVar2 = box::operator[](&P,1);
      interval::operator=((interval *)&xhat,piVar2);
      piVar2 = box::operator[](&P,2);
      interval::operator=((interval *)&yhat,piVar2);
      pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
      bStaticSonarLocalization = 0;
      box::~box(&P0);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&circles_r_tmp.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&circles_y_tmp.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&circles_x_tmp.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&walls_yb_tmp.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&walls_xb_tmp.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&walls_ya_tmp.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&walls_xa_tmp.super__Vector_base<double,_std::allocator<double>_>);
      std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base
                (&alpha_mes_vector_tmp.super__Deque_base<double,_std::allocator<double>_>);
      std::
      deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
      ::~deque(&d_all_mes_vector_tmp);
      box::~box(&P);
    }
    if (bDynamicSonarLocalization != 0) {
      dVar4 = GetTimeElapsedChronoQuick(&chrono_dynamicsonarlocalization);
      if (dynamicsonarlocalization_period < dVar4) {
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        interval::interval(&local_150,(interval *)&xhat);
        interval::interval(&local_168,(interval *)&yhat);
        box::box((box *)&d_max_err_tmp,(vector<interval,_std::allocator<interval>_> *)&local_150,
                 (vector<interval,_std::allocator<interval>_> *)&local_168);
        bVar1 = box::IsEmpty((box *)&d_max_err_tmp);
        if (bVar1) {
          alpha_mes_vector_tmp.super__Deque_base<double,_std::allocator<double>_>._M_impl.
          super__Deque_impl_data._M_map = (_Map_pointer)0xc0c3880000000000;
          psihat_tmp.inf = 10000.0;
          interval::interval(&local_2d0,(double *)&alpha_mes_vector_tmp,&psihat_tmp.inf);
          alphashat_tmp.inf = -10000.0;
          walls_xa_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x40c3880000000000;
          interval::interval(&local_180,&alphashat_tmp.inf,(double *)&walls_xa_tmp);
          box::box((box *)&d_all_mes_vector_tmp,
                   (vector<interval,_std::allocator<interval>_> *)&local_2d0,
                   (vector<interval,_std::allocator<interval>_> *)&local_180);
          box::operator=((box *)&d_max_err_tmp,(box *)&d_all_mes_vector_tmp);
          box::~box((box *)&d_all_mes_vector_tmp);
        }
        std::
        deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
        ::deque(&d_all_mes_vector_tmp,&d_all_mes_vector);
        std::deque<double,_std::allocator<double>_>::deque(&alpha_mes_vector_tmp,&alpha_mes_vector);
        std::deque<double,_std::allocator<double>_>::deque
                  ((deque<double,_std::allocator<double>_> *)&psihat_tmp,&t_history_vector);
        std::deque<interval,_std::allocator<interval>_>::deque
                  ((deque<interval,_std::allocator<interval>_> *)&alphashat_tmp,&xhat_history_vector
                  );
        std::deque<interval,_std::allocator<interval>_>::deque
                  ((deque<interval,_std::allocator<interval>_> *)&walls_xa_tmp,&yhat_history_vector)
        ;
        std::deque<interval,_std::allocator<interval>_>::deque
                  ((deque<interval,_std::allocator<interval>_> *)&walls_ya_tmp,
                   &psihat_history_vector);
        std::deque<interval,_std::allocator<interval>_>::deque
                  ((deque<interval,_std::allocator<interval>_> *)&walls_xb_tmp,
                   &vrxhat_history_vector);
        d_max_err_tmp_1 = d_max_err;
        alpha_max_err_tmp_1 = alpha_max_err;
        sdir_tmp_1 = 1;
        circles_x_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        interval::interval((interval *)&walls_yb_tmp,(double *)&circles_x_tmp);
        std::vector<double,_std::allocator<double>_>::vector(&circles_x_tmp,&walls_xa);
        std::vector<double,_std::allocator<double>_>::vector(&circles_y_tmp,&walls_ya);
        std::vector<double,_std::allocator<double>_>::vector(&circles_r_tmp,&walls_xb);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&P,&walls_yb);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&P0,&circles_x);
        std::vector<double,_std::allocator<double>_>::vector(&circles_y_tmp_1,&circles_y);
        std::vector<double,_std::allocator<double>_>::vector(&circles_r_tmp_1,&circles_r);
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        sched_yield();
        box::box(&local_5b0,(box *)&d_max_err_tmp);
        SIVIA_dyn((box *)&alpha_max_err_tmp,
                  (deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                   *)&local_5b0,(deque<double,_std::allocator<double>_> *)&d_all_mes_vector_tmp,
                  &alpha_mes_vector_tmp,(deque<interval,_std::allocator<interval>_> *)&psihat_tmp,
                  (deque<interval,_std::allocator<interval>_> *)&alphashat_tmp,
                  (deque<interval,_std::allocator<interval>_> *)&walls_xa_tmp,
                  (deque<interval,_std::allocator<interval>_> *)&walls_ya_tmp,
                  (double *)&walls_xb_tmp,&d_max_err_tmp_1,(int *)&alpha_max_err_tmp_1,
                  (interval *)&sdir_tmp_1,&walls_yb_tmp,
                  (vector<double,_std::allocator<double>_> *)
                  &circles_x_tmp.super__Vector_base<double,_std::allocator<double>_>,&circles_y_tmp,
                  &circles_r_tmp,(vector<double,_std::allocator<double>_> *)&P,
                  (vector<double,_std::allocator<double>_> *)&P0,&circles_y_tmp_1);
        box::operator=((box *)&d_max_err_tmp,(box *)&alpha_max_err_tmp);
        box::~box((box *)&alpha_max_err_tmp);
        box::~box(&local_5b0);
        sched_yield();
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        interval::interval(&local_2e8,(interval *)&xhat);
        interval::interval(&local_300,(interval *)&yhat);
        box::box((box *)&alpha_max_err_tmp,(vector<interval,_std::allocator<interval>_> *)&local_2e8
                 ,(vector<interval,_std::allocator<interval>_> *)&local_300);
        bVar1 = box::IsEmpty((box *)&alpha_max_err_tmp);
        if (bVar1) {
          local_6e0.data = (interval *)0xc0c3880000000000;
          _sdir_tmp = 10000.0;
          interval::interval(&local_318,(double *)&local_6e0,(double *)&sdir_tmp);
          local_6a8 = -10000.0;
          local_6b0 = 10000.0;
          interval::interval(&local_198,&local_6a8,&local_6b0);
          box::box((box *)&snr_loc_max_err,(vector<interval,_std::allocator<interval>_> *)&local_318
                   ,(vector<interval,_std::allocator<interval>_> *)&local_198);
          box::operator=((box *)&alpha_max_err_tmp,(box *)&snr_loc_max_err);
          box::~box((box *)&snr_loc_max_err);
        }
        box::Intersect((box *)&d_max_err_tmp,(box *)&alpha_max_err_tmp);
        dVar4 = d_max_err;
        dVar3 = sin(alpha_max_err);
        _sdir_tmp = ABS(dVar3 + dVar4 + dVar3 + dVar4);
        bVar1 = box::IsEmpty((box *)&d_max_err_tmp);
        if (bVar1) {
          local_6a8 = -_sdir_tmp;
          interval::interval(&local_330,&local_6a8,(double *)&sdir_tmp);
          local_6b0 = -_sdir_tmp;
          interval::interval(&local_1b0,&local_6b0,(double *)&sdir_tmp);
          box::box(&local_6e0,(vector<interval,_std::allocator<interval>_> *)&local_330,
                   (vector<interval,_std::allocator<interval>_> *)&local_1b0);
          operator+((box *)&snr_loc_max_err,(box *)&alpha_max_err_tmp);
          box::operator=((box *)&d_max_err_tmp,(box *)&snr_loc_max_err);
        }
        else {
          local_6a8 = -_sdir_tmp;
          interval::interval(&local_348,&local_6a8,(double *)&sdir_tmp);
          local_6b0 = -_sdir_tmp;
          interval::interval(&local_1c8,&local_6b0,(double *)&sdir_tmp);
          box::box(&local_6e0,(vector<interval,_std::allocator<interval>_> *)&local_348,
                   (vector<interval,_std::allocator<interval>_> *)&local_1c8);
          operator+((box *)&snr_loc_max_err,(box *)&d_max_err_tmp);
          box::operator=((box *)&d_max_err_tmp,(box *)&snr_loc_max_err);
        }
        box::~box((box *)&snr_loc_max_err);
        box::~box(&local_6e0);
        bVar1 = box::IsEmpty((box *)&d_max_err_tmp);
        if (bVar1) {
          local_6e0.data = (interval *)0xc0c3880000000000;
          local_6a8 = 10000.0;
          interval::interval(&local_360,(double *)&local_6e0,&local_6a8);
          local_6b0 = -10000.0;
          local_5e8 = 10000.0;
          interval::interval(&local_1e0,&local_6b0,&local_5e8);
          box::box((box *)&snr_loc_max_err,(vector<interval,_std::allocator<interval>_> *)&local_360
                   ,(vector<interval,_std::allocator<interval>_> *)&local_1e0);
          box::operator=((box *)&d_max_err_tmp,(box *)&snr_loc_max_err);
          box::~box((box *)&snr_loc_max_err);
        }
        piVar2 = box::operator[]((box *)&d_max_err_tmp,1);
        interval::operator=((interval *)&xhat,piVar2);
        piVar2 = box::operator[]((box *)&d_max_err_tmp,2);
        interval::operator=((interval *)&yhat,piVar2);
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        StopChronoQuick(&chrono_dynamicsonarlocalization);
        StartChrono(&chrono_dynamicsonarlocalization);
        box::~box((box *)&alpha_max_err_tmp);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&circles_r_tmp_1.super__Vector_base<double,_std::allocator<double>_>);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&circles_y_tmp_1.super__Vector_base<double,_std::allocator<double>_>);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)&P0);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)&P);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&circles_r_tmp.super__Vector_base<double,_std::allocator<double>_>);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&circles_y_tmp.super__Vector_base<double,_std::allocator<double>_>);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&circles_x_tmp.super__Vector_base<double,_std::allocator<double>_>);
        std::_Deque_base<interval,_std::allocator<interval>_>::~_Deque_base
                  ((_Deque_base<interval,_std::allocator<interval>_> *)&walls_xb_tmp);
        std::_Deque_base<interval,_std::allocator<interval>_>::~_Deque_base
                  ((_Deque_base<interval,_std::allocator<interval>_> *)&walls_ya_tmp);
        std::_Deque_base<interval,_std::allocator<interval>_>::~_Deque_base
                  ((_Deque_base<interval,_std::allocator<interval>_> *)&walls_xa_tmp);
        std::_Deque_base<interval,_std::allocator<interval>_>::~_Deque_base
                  ((_Deque_base<interval,_std::allocator<interval>_> *)&alphashat_tmp);
        std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base
                  ((_Deque_base<double,_std::allocator<double>_> *)&psihat_tmp);
        std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base
                  (&alpha_mes_vector_tmp.super__Deque_base<double,_std::allocator<double>_>);
        std::
        deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
        ::~deque(&d_all_mes_vector_tmp);
        box::~box((box *)&d_max_err_tmp);
      }
    }
  } while (bExit == 0);
  StopChronoQuick(&chrono_period);
  StopChronoQuick(&chrono_dynamicsonarlocalization);
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE SonarLocalizationThread(void* pParam)
{
	CHRONO chrono_period;
	CHRONO chrono_dynamicsonarlocalization;

	UNREFERENCED_PARAMETER(pParam);

	// Dynamic sonar localization disabled by default, use enable/disabledynamicsonarlocalization commands to enable/disable...
	bDynamicSonarLocalization = FALSE;

	StartChrono(&chrono_dynamicsonarlocalization);

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		uSleep(1000*50);

		if (bStaticSonarLocalization)
		{

			// What if there is no sonar connected...?


			EnterCriticalSection(&StateVariablesCS);
			// Initial box to be able to contract...?
			box P = box(xhat,yhat);
			if (P.IsEmpty()) P = box(interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY),interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY));

			deque< vector<interval> > d_all_mes_vector_tmp = d_all_mes_vector; deque<double> alpha_mes_vector_tmp = alpha_mes_vector; 
			interval psihat_tmp = psihat; 
			double d_max_err_tmp = d_max_err; double alpha_max_err_tmp = alpha_max_err; int sdir_tmp = 1; interval alphashat_tmp = 0; 
			vector<double> walls_xa_tmp = walls_xa; vector<double> walls_ya_tmp = walls_ya; vector<double> walls_xb_tmp = walls_xb; vector<double> walls_yb_tmp = walls_yb; 
			vector<double> circles_x_tmp = circles_x; vector<double> circles_y_tmp = circles_y; vector<double> circles_r_tmp = circles_r;
			LeaveCriticalSection(&StateVariablesCS);

			ThreadYield();

			P = SIVIA(P, d_all_mes_vector_tmp, alpha_mes_vector_tmp, 
				psihat_tmp, 
				d_max_err_tmp, alpha_max_err_tmp, sdir_tmp, alphashat_tmp, 
				walls_xa_tmp, walls_ya_tmp, walls_xb_tmp, walls_yb_tmp, 
				circles_x_tmp, circles_y_tmp, circles_r_tmp);

			ThreadYield();

			EnterCriticalSection(&StateVariablesCS);
			box P0 = box(xhat,yhat); // Need to check for other position updates since the computations were long...
			if (P0.IsEmpty()) P0 = box(interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY),interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY));
			P.Intersect(P0);
			double snr_loc_max_err = fabs(2*(d_max_err+sin(alpha_max_err)));
			if (P.IsEmpty()) 
			{
				// Expand initial box to be able to contract next time and because we are probably lost...
				P = P0+box(interval(-snr_loc_max_err,snr_loc_max_err),interval(-snr_loc_max_err,snr_loc_max_err));
			}
			else
			{
				// P is likely to be with a small width so we expand...
				P = P+box(interval(-snr_loc_max_err,snr_loc_max_err),interval(-snr_loc_max_err,snr_loc_max_err));
			}
			if (P.IsEmpty()) P = box(interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY),interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY));
			xhat = P[1];
			yhat = P[2];
			LeaveCriticalSection(&StateVariablesCS);

			bStaticSonarLocalization = FALSE;
		}

		if (bDynamicSonarLocalization&&(GetTimeElapsedChronoQuick(&chrono_dynamicsonarlocalization) > dynamicsonarlocalization_period))
		{

			// What if there is no sonar connected...?


			EnterCriticalSection(&StateVariablesCS);
			// Initial box to be able to contract...?
			box P = box(xhat,yhat);
			if (P.IsEmpty()) P = box(interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY),interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY));

			deque< vector<interval> > d_all_mes_vector_tmp = d_all_mes_vector; deque<double> alpha_mes_vector_tmp = alpha_mes_vector; 
			deque<double> t_history_vector_tmp = t_history_vector; deque<interval> xhat_history_vector_tmp = xhat_history_vector; deque<interval> yhat_history_vector_tmp = yhat_history_vector; 
			deque<interval> psihat_history_vector_tmp = psihat_history_vector; deque<interval> vrxhat_history_vector_tmp = vrxhat_history_vector; 
			double d_max_err_tmp = d_max_err; double alpha_max_err_tmp = alpha_max_err; int sdir_tmp = 1; interval alphashat_tmp = 0; 
			vector<double> walls_xa_tmp = walls_xa; vector<double> walls_ya_tmp = walls_ya; vector<double> walls_xb_tmp = walls_xb; vector<double> walls_yb_tmp = walls_yb; 
			vector<double> circles_x_tmp = circles_x; vector<double> circles_y_tmp = circles_y; vector<double> circles_r_tmp = circles_r;
			LeaveCriticalSection(&StateVariablesCS);

			ThreadYield();

			P = SIVIA_dyn(P, d_all_mes_vector_tmp, alpha_mes_vector_tmp, 
				t_history_vector_tmp, xhat_history_vector_tmp, yhat_history_vector_tmp, 
				psihat_history_vector_tmp, vrxhat_history_vector_tmp, 
				d_max_err_tmp, alpha_max_err_tmp, sdir_tmp, alphashat_tmp, 
				walls_xa_tmp, walls_ya_tmp, walls_xb_tmp, walls_yb_tmp, 
				circles_x_tmp, circles_y_tmp, circles_r_tmp);

			ThreadYield();

			EnterCriticalSection(&StateVariablesCS);
			box P0 = box(xhat,yhat); // Need to check for other position updates since the computations were long...
			if (P0.IsEmpty()) P0 = box(interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY),interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY));
			P.Intersect(P0);
			double snr_loc_max_err = fabs(2*(d_max_err+sin(alpha_max_err)));
			if (P.IsEmpty()) 
			{
				// Expand initial box to be able to contract next time and because we are probably lost...
				P = P0+box(interval(-snr_loc_max_err,snr_loc_max_err),interval(-snr_loc_max_err,snr_loc_max_err));
			}
			else
			{
				// P is likely to be with a small width so we expand...
				P = P+box(interval(-snr_loc_max_err,snr_loc_max_err),interval(-snr_loc_max_err,snr_loc_max_err));
			}
			if (P.IsEmpty()) P = box(interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY),interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY));
			xhat = P[1];
			yhat = P[2];
			LeaveCriticalSection(&StateVariablesCS);

			StopChronoQuick(&chrono_dynamicsonarlocalization);
			StartChrono(&chrono_dynamicsonarlocalization);
		}

		//printf("SonarLocalizationThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));

		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	StopChronoQuick(&chrono_dynamicsonarlocalization);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}